

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFileEqnStorage.cpp
# Opt level: O0

void __thiscall
TPZFileEqnStorage<std::complex<double>_>::AddEqnArray
          (TPZFileEqnStorage<std::complex<double>_> *this,
          TPZEqnArray<std::complex<double>_> *EqnArray)

{
  FILE *__stream;
  long *plVar1;
  long lVar2;
  TPZEqnArray<std::complex<double>_> *in_RDI;
  int64_t nextaddress;
  TPZFileEqnStorage<std::complex<double>_> *in_stack_00000050;
  FILE *in_stack_ffffffffffffffd8;
  long local_18 [3];
  
  if ((in_RDI->fEqStart).super_TPZManVector<int,_100>.fExtAlloc[0x20] %
      (*(int *)&(in_RDI->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>._vptr_TPZVec + -1)
      == 0) {
    WriteHeaders(in_stack_00000050);
  }
  else if ((in_RDI->fEqStart).super_TPZManVector<int,_100>.fExtAlloc[0x20] != 0) {
    in_stack_ffffffffffffffd8 =
         (FILE *)&(in_RDI->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore;
    TPZVec<long>::operator[]
              ((TPZVec<long> *)
               &(in_RDI->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore,
               (long)((in_RDI->fEqStart).super_TPZManVector<int,_100>.fExtAlloc[0x20] + -1));
    TPZStack<long,_10>::Push((TPZStack<long,_10> *)in_RDI,(long)in_stack_ffffffffffffffd8);
  }
  TPZEqnArray<std::complex<double>_>::Write(in_RDI,in_stack_ffffffffffffffd8);
  local_18[0] = ftell(*(FILE **)((in_RDI->fEqStart).super_TPZManVector<int,_100>.fExtAlloc + 0x1e));
  __stream = *(FILE **)((in_RDI->fEqStart).super_TPZManVector<int,_100>.fExtAlloc + 0x1e);
  plVar1 = TPZVec<long>::operator[]
                     ((TPZVec<long> *)
                      &(in_RDI->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore,
                      (long)(in_RDI->fEqStart).super_TPZManVector<int,_100>.fExtAlloc[0x20]);
  fseek(__stream,*plVar1 + 8,0);
  lVar2 = ftell(*(FILE **)((in_RDI->fEqStart).super_TPZManVector<int,_100>.fExtAlloc + 0x1e));
  (in_RDI->fEqStart).super_TPZManVector<int,_100>.fExtAlloc[0x21] = (int)lVar2;
  fwrite(local_18,8,1,*(FILE **)((in_RDI->fEqStart).super_TPZManVector<int,_100>.fExtAlloc + 0x1e));
  fseek(*(FILE **)((in_RDI->fEqStart).super_TPZManVector<int,_100>.fExtAlloc + 0x1e),local_18[0],0);
  (in_RDI->fEqStart).super_TPZManVector<int,_100>.fExtAlloc[0x20] =
       (in_RDI->fEqStart).super_TPZManVector<int,_100>.fExtAlloc[0x20] + 1;
  return;
}

Assistant:

void TPZFileEqnStorage<TVar>::AddEqnArray(TPZEqnArray<TVar> *EqnArray)
{
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
	{
		std::stringstream sout;
		sout << "fCurrentBlock "<< fCurrentBlock << " fNumHeaders " << fNumHeaders;
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
  	
	if(fCurrentBlock%(fNumHeaders-1)==0) {
#ifdef PZ_LOG
        if (logger.isDebugEnabled()) {
            LOGPZ_DEBUG(logger,"writing headers")
        }
#endif
		WriteHeaders();
		//		fBlockPos.Push(fBlockPos[fCurrentBlock-1]+sizeof(int64_t));
		
	}else if(fCurrentBlock!=0){
#ifdef PZ_LOG
        if (logger.isDebugEnabled())
		{
            std::stringstream sout;
            sout << "fCurrentBlock " << fCurrentBlock << " fBlockPos[fCurrentBlock-1] "<< fBlockPos[fCurrentBlock-1] << fBlockPos;
            LOGPZ_DEBUG(logger,sout.str())
		}
#endif
		fBlockPos.Push(fBlockPos[fCurrentBlock-1]+sizeof(int64_t));
	}
	
	EqnArray->Write(fIOStream); 
	
	/**Gets actual position on fIOStream */
	int64_t nextaddress=ftell(fIOStream);

	/** 
	 *Writes this address on next available header block
	 *and sets pointer to its previous position
	 */
	//fseek(fIOStream,fCurBlockPosition+sizeof(int64_t),SEEK_SET);
	fseek(fIOStream,fBlockPos[fCurrentBlock]+sizeof(int64_t),SEEK_SET);
  	fCurBlockPosition=ftell(fIOStream);
  	fwrite(&nextaddress,sizeof(int64_t),1,fIOStream);
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
	{
		std::stringstream sout;
		sout << "nextaddress " << nextaddress << " fCurBlockPosition " << fCurBlockPosition;
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	
	fseek(fIOStream,nextaddress,SEEK_SET);
	
	fCurrentBlock++;
}